

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_ccall.c
# Opt level: O1

int lj_ccall_func(lua_State *L,GCcdata *cd)

{
  CTSize *pCVar1;
  CTSize CVar2;
  CTState *cts;
  uint64_t uVar3;
  CTInfo CVar4;
  int iVar5;
  uint uVar6;
  uint uVar7;
  void *pvVar8;
  ulong uVar9;
  TValue *pTVar10;
  ulong uVar11;
  uint uVar12;
  uint uVar13;
  cTValue *pcVar14;
  uint32_t i;
  long lVar15;
  CType *pCVar16;
  int iVar17;
  uint uVar18;
  CType *pCVar19;
  bool bVar20;
  bool bVar21;
  int rcl [2];
  CCallState cc;
  cTValue *local_248;
  uint local_240 [2];
  cTValue *local_238;
  CType *local_230;
  cTValue local_228 [3];
  uint local_20c;
  cTValue *local_208;
  TValue *local_200;
  ulong local_1f8;
  uint local_1f0;
  byte local_1ec;
  char local_1eb;
  byte local_1ea;
  byte local_1e9;
  cTValue local_1e8 [16];
  cTValue local_168 [6];
  cTValue local_138 [33];
  
  cts = *(CTState **)((L->glref).ptr64 + 0x180);
  cts->L = L;
  pCVar16 = cts->tab;
  pCVar19 = pCVar16 + cd->ctypeid;
  if ((pCVar16[cd->ctypeid].info & 0xf0000000) == 0x20000000) {
    pCVar1 = &pCVar19->size;
    pCVar19 = pCVar16 + (ushort)pCVar19->info;
    bVar20 = *pCVar1 == 4;
  }
  else {
    bVar20 = false;
  }
  if ((pCVar19->info & 0xf0000000) != 0x60000000) {
    return -1;
  }
  if (bVar20) {
    local_1f8 = (ulong)(uint)cd[1].nextgc.gcptr64;
  }
  else {
    local_1f8 = cd[1].nextgc.gcptr64;
  }
  local_200 = L->top;
  memset(local_1e8,0,0xb0);
  pCVar16 = cts->tab + (ushort)pCVar19->info;
  uVar6 = pCVar16->info;
  if ((uVar6 & 0xf8000000) == 0x38000000) {
    uVar7 = 0;
    if ((pCVar16->size != 8) && (pCVar16->size != 0x10)) {
LAB_0014ca11:
      lj_err_caller(L,LJ_ERR_FFI_NYICALL);
    }
  }
  else {
    uVar7 = 0;
    if ((uVar6 & 0xf4000000) == 0x34000000 || (uVar6 & 0xf0000000) == 0x10000000) {
      CVar4 = pCVar19->info;
      pvVar8 = lj_mem_newgco(cts->L,(ulong)pCVar16->size + 0x10);
      *(undefined1 *)((long)pvVar8 + 9) = 10;
      *(short *)((long)pvVar8 + 10) = (short)CVar4;
      pTVar10 = L->top;
      L->top = pTVar10 + 1;
      pTVar10->u64 = (ulong)pvVar8 | 0xfffa800000000000;
      if ((pCVar16->info & 0xf0000000) == 0x10000000) {
        local_228[0].u64 = 0;
        iVar17 = ccall_classify_struct(cts,pCVar16,(int *)&local_228[0].it64,0);
        if (iVar17 != 0) {
          local_168[0].u64 = (long)pvVar8 + 0x10;
          local_1eb = '\x01';
          uVar7 = 1;
          goto LAB_0014c357;
        }
      }
      local_1eb = '\0';
      uVar7 = 0;
    }
  }
LAB_0014c357:
  local_208 = local_168;
  uVar6 = (uint)pCVar19->sib;
  uVar11 = 0;
  if (uVar6 == 0) {
    uVar6 = 0;
  }
  local_248 = L->base + 1;
  if (local_248 < local_200) {
    uVar13 = 0;
    iVar17 = 1;
    uVar11 = 0;
    do {
      if (uVar6 == 0) {
        if ((pCVar19->info & 0x800000) == 0) goto LAB_0014ca1f;
        uVar6 = lj_ccall_ctid_vararg(cts,local_248);
        local_20c = 0;
      }
      else {
        local_20c = (uint)cts->tab[uVar6].sib;
        uVar6 = (uint)(ushort)cts->tab[uVar6].info;
      }
      uVar18 = cts->tab[uVar6].info;
      pCVar16 = cts->tab + uVar6;
      uVar6 = pCVar16->size;
      local_230 = pCVar16;
      if (uVar18 < 0x10000000) {
        if (8 < uVar6) goto LAB_0014ca11;
        bVar20 = (uVar18 >> 0x1a & 1) == 0;
LAB_0014c60b:
        bVar21 = false;
LAB_0014c60e:
        uVar18 = uVar6 + 7 >> 3;
        if (bVar20) {
          if ((0x17 < uVar6 + 7) || (6 < uVar7 + uVar18)) {
LAB_0014c687:
            if (0x30000 < (pCVar16->info & 0xf0000)) {
              uVar6 = -1 << ((byte)(pCVar16->info + 0xd0000 >> 0x10) & 0xf);
              uVar13 = uVar13 + ~uVar6 & uVar6;
            }
            if (uVar13 + uVar18 < 0x21) {
              pcVar14 = local_138 + uVar13;
              uVar6 = (uint)uVar11;
              uVar13 = uVar13 + uVar18;
              goto LAB_0014c6e3;
            }
            goto LAB_0014ca11;
          }
          pcVar14 = local_168 + uVar7;
          uVar7 = uVar7 + uVar18;
        }
        else {
          uVar6 = uVar18;
          if ((pCVar16->info & 0xf8000000) == 0x38000000) {
            uVar6 = 1;
          }
          uVar6 = uVar6 + (uint)uVar11;
          pcVar14 = local_1e8 + uVar11 * 2;
          if (8 < uVar6) goto LAB_0014c687;
LAB_0014c6e3:
          uVar11 = (ulong)uVar6;
        }
        local_238 = pcVar14;
        lj_cconv_ct_tv(cts,local_230,(uint8_t *)&pcVar14->u64,local_248,iVar17 << 8);
        if (((local_230->info & 0xf4000000) == 0) && (uVar6 = local_230->size, uVar6 < 4)) {
          if ((local_230->info >> 0x17 & 1) == 0) {
            if (uVar6 == 1) {
              uVar6 = (uint)(char)*(byte *)local_238;
            }
            else {
              uVar6 = (uint)(short)*(ushort *)local_238;
            }
          }
          else if (uVar6 == 1) {
            uVar6 = (uint)*(byte *)local_238;
          }
          else {
            uVar6 = (uint)*(ushort *)local_238;
          }
          *(uint *)local_238 = uVar6;
        }
        if ((bool)(bVar21 & uVar18 == 2)) {
          uVar9 = (ulong)((int)uVar11 - 2);
          if (local_238 == local_1e8 + uVar9 * 2) {
            local_1e8[(ulong)((int)uVar11 - 1) * 2] = local_1e8[uVar9 * 2 + 1];
            local_1e8[uVar9 * 2 + 1].u64 = 0;
          }
        }
      }
      else {
        if ((uVar18 & 0xf8000000) == 0x38000000) {
          bVar20 = false;
          if (uVar6 == 8) goto LAB_0014c60b;
          bVar21 = false;
          if (uVar6 == 0x10) goto LAB_0014c60e;
          goto LAB_0014ca11;
        }
        if ((uVar18 & 0xf0000000) != 0x10000000) {
          bVar21 = (uVar18 & 0xf4000000) == 0x34000000;
          bVar20 = !bVar21;
          if (!bVar21) {
            uVar6 = 8;
          }
          goto LAB_0014c60e;
        }
        local_240[0] = 0;
        local_240[1] = 0;
        iVar5 = ccall_classify_struct(cts,pCVar16,(int *)local_240,0);
        if (iVar5 == 0) {
          local_1ec = (byte)uVar13;
          local_1ea = (byte)uVar7;
          local_1e9 = (byte)uVar11;
          local_228[0].u64 = 0;
          local_228[1] = (cTValue)0x0;
          lj_cconv_ct_tv(cts,pCVar16,(uint8_t *)&local_228[0].u64,local_248,iVar17 << 8);
          uVar12 = (uint)local_1ea;
          uVar18 = (uint)local_1e9;
          lVar15 = 0;
          do {
            if ((local_240[lVar15] & 1) == 0) {
              if ((local_240[lVar15] & 2) != 0) {
                if (7 < uVar18) goto LAB_0014c58f;
                uVar9 = (ulong)uVar18;
                uVar18 = uVar18 + 1;
                local_1e8[uVar9 * 2] = local_228[lVar15];
              }
            }
            else {
              if (5 < uVar12) {
LAB_0014c58f:
                uVar9 = (ulong)local_1ec;
                iVar5 = 2 - (uint)(local_240[1] == 0);
                uVar18 = iVar5 + (uint)local_1ec;
                if (uVar18 < 0x21) {
                  local_1ec = (byte)uVar18;
                  memcpy(local_138 + uVar9,local_228,(ulong)(uint)(iVar5 * 8));
                  goto LAB_0014c5cb;
                }
                iVar5 = 2;
                pCVar16 = local_230;
                goto LAB_0014c5f7;
              }
              uVar9 = (ulong)uVar12;
              uVar12 = uVar12 + 1;
              local_168[uVar9] = local_228[lVar15];
            }
            lVar15 = lVar15 + 1;
          } while (lVar15 == 1);
          local_1ea = (byte)uVar12;
          local_1e9 = (byte)uVar18;
LAB_0014c5cb:
          uVar13 = (uint)local_1ec;
          uVar7 = (uint)local_1ea;
          uVar11 = (ulong)local_1e9;
          iVar5 = 7;
          pCVar16 = local_230;
        }
        else {
          iVar5 = 0;
        }
LAB_0014c5f7:
        if (iVar5 == 0) {
          bVar20 = true;
          goto LAB_0014c60b;
        }
        if (iVar5 != 7) {
          if (iVar5 == 2) goto LAB_0014ca11;
          goto LAB_0014c800;
        }
      }
      iVar17 = iVar17 + 1;
      local_248 = local_248 + 1;
      uVar6 = local_20c;
    } while (local_248 < local_200);
  }
  else {
    uVar13 = 0;
  }
  if (uVar6 != 0) {
LAB_0014ca1f:
    lj_err_caller(L,LJ_ERR_FFI_NUMARG);
  }
  local_1e9 = (byte)uVar11;
  local_1ec = (byte)uVar13;
  local_1f0 = 8;
  if (1 < uVar13) {
    local_1f0 = uVar13 * 8 | 8;
  }
LAB_0014c800:
  pCVar16 = cts->tab;
  (cts->cb).slot = 0xffffffff;
  lj_vm_ffi_call(&local_1f8);
  if ((cts->cb).slot != 0xffffffff) {
    local_228[0].u64 = local_1f8 >> 2;
    pTVar10 = lj_tab_set(L,cts->miscmap,local_228);
    pTVar10->u64 = 0xfffeffffffffffff;
  }
  pCVar19 = cts->tab + *(ushort *)((long)pCVar19 + ((long)cts->tab - (long)pCVar16));
  uVar6 = pCVar19->info;
  if ((uVar6 & 0xf0000000) == 0x40000000) {
    iVar5 = 0;
    iVar17 = 0;
    goto LAB_0014c9c9;
  }
  if ((uVar6 & 0xf0000000) == 0x10000000) {
    if (local_1eb == '\0') {
      uVar11 = L->top[-1].u64;
      local_240[0] = 0;
      local_240[1] = 0;
      lVar15 = 0;
      ccall_classify_struct(cts,pCVar19,(int *)local_240,0);
      uVar6 = pCVar19->size;
      uVar7 = 0;
      uVar13 = 0;
      do {
        if ((local_240[lVar15] & 1) == 0) {
          if ((local_240[lVar15] & 2) != 0) {
            uVar9 = (ulong)uVar7;
            uVar7 = uVar7 + 1;
            pcVar14 = local_1e8 + uVar9 * 2;
            goto LAB_0014c90c;
          }
        }
        else {
          uVar9 = (ulong)uVar13;
          uVar13 = uVar13 + 1;
          pcVar14 = local_168 + uVar9;
LAB_0014c90c:
          local_228[lVar15] = *pcVar14;
        }
        lVar15 = lVar15 + 1;
      } while (lVar15 == 1);
      memcpy((void *)((uVar11 & 0x7fffffffffff) + 0x10),local_228,(ulong)uVar6);
    }
LAB_0014c989:
    iVar5 = 1;
    iVar17 = 1;
  }
  else {
    if ((uVar6 & 0xf4000000) == 0x4000000) {
LAB_0014c9a1:
      local_208 = local_1e8;
    }
    else {
      if ((uVar6 & 0xf4000000) == 0x34000000) {
        uVar11 = L->top[-1].u64 & 0x7fffffffffff;
        CVar2 = pCVar19->size;
        *(cTValue *)(uVar11 + 0x10) = local_1e8[0];
        if (CVar2 != 8) {
          *(cTValue *)(uVar11 + 0x18) = local_1e8[2];
        }
        goto LAB_0014c989;
      }
      if ((uVar6 & 0xf8000000) == 0x38000000) goto LAB_0014c9a1;
    }
    iVar17 = lj_cconv_tv_ct(cts,pCVar19,0,L->top + -1,(uint8_t *)&local_208->u64);
    iVar5 = 1;
  }
LAB_0014c9c9:
  if (0 < iVar17) {
    iVar17 = iVar17 + 1;
    do {
      uVar3 = (L->glref).ptr64;
      if (*(ulong *)(uVar3 + 0x18) <= *(ulong *)(uVar3 + 0x10)) {
        lj_gc_step(L);
      }
      iVar17 = iVar17 + -1;
    } while (1 < iVar17);
  }
  return iVar5;
}

Assistant:

int lj_ccall_func(lua_State *L, GCcdata *cd)
{
  CTState *cts = ctype_cts(L);
  CType *ct = ctype_raw(cts, cd->ctypeid);
  CTSize sz = CTSIZE_PTR;
  if (ctype_isptr(ct->info)) {
    sz = ct->size;
    ct = ctype_rawchild(cts, ct);
  }
  if (ctype_isfunc(ct->info)) {
    CCallState cc;
    int gcsteps, ret;
    cc.func = (void (*)(void))cdata_getptr(cdataptr(cd), sz);
    gcsteps = ccall_set_args(L, cts, ct, &cc);
    ct = (CType *)((intptr_t)ct-(intptr_t)cts->tab);
    cts->cb.slot = ~0u;
    lj_vm_ffi_call(&cc);
    if (cts->cb.slot != ~0u) {  /* Blacklist function that called a callback. */
      TValue tv;
      tv.u64 = ((uintptr_t)(void *)cc.func >> 2) | U64x(800000000, 00000000);
      setboolV(lj_tab_set(L, cts->miscmap, &tv), 1);
    }
    ct = (CType *)((intptr_t)ct+(intptr_t)cts->tab);  /* May be reallocated. */
    gcsteps += ccall_get_results(L, cts, ct, &cc, &ret);
#if LJ_TARGET_X86 && LJ_ABI_WIN
    /* Automatically detect __stdcall and fix up C function declaration. */
    if (cc.spadj && ctype_cconv(ct->info) == CTCC_CDECL) {
      CTF_INSERT(ct->info, CCONV, CTCC_STDCALL);
      lj_trace_abort(G(L));
    }
#endif
    while (gcsteps-- > 0)
      lj_gc_check(L);
    return ret;
  }
  return -1;  /* Not a function. */
}